

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense.hpp
# Opt level: O0

void __thiscall
remora::matrix<double,remora::column_major,remora::cpu_tag>::
matrix<remora::matrix<double,remora::row_major,remora::cpu_tag>>
          (matrix<double,_remora::column_major,_remora::cpu_tag> *this,
          matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
          *e)

{
  matrix<double,_remora::row_major,_remora::cpu_tag> *pmVar1;
  size_type sVar2;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag> *A;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RSI;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *in_RDI;
  allocator_type *__a;
  size_type in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  allocator_type local_11;
  matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
  *local_10;
  
  local_10 = in_RSI;
  pmVar1 = matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(in_RSI);
  sVar2 = matrix<double,_remora::row_major,_remora::cpu_tag>::size1(pmVar1);
  *(size_type *)in_RDI = sVar2;
  pmVar1 = matrix_expression<remora::matrix<double,_remora::row_major,_remora::cpu_tag>,_remora::cpu_tag>
           ::operator()(local_10);
  sVar2 = matrix<double,_remora::row_major,_remora::cpu_tag>::size2(pmVar1);
  *(size_type *)(in_RDI + 8) = sVar2;
  A = in_RDI + 0x10;
  __a = &local_11;
  std::allocator<double>::allocator((allocator<double> *)0x10dc88);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__a);
  std::allocator<double>::~allocator((allocator<double> *)0x10dca8);
  assign<remora::matrix<double,remora::column_major,remora::cpu_tag>,remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::cpu_tag>
            ((matrix_expression<remora::matrix<double,_remora::column_major,_remora::cpu_tag>,_remora::cpu_tag>
              *)A,in_RDI);
  return;
}

Assistant:

matrix(matrix_expression<E, cpu_tag> const& e)
	: m_size1(e().size1())
	, m_size2(e().size2())
	, m_data(m_size1 * m_size2) {
		assign(*this,e);
	}